

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

uint64_t modinv2p64(uint64_t x)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint64_t uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int32_t *in_RSI;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iStack_ac;
  secp256k1_modinv32_trans2x2 sStack_a8;
  undefined8 uStack_98;
  secp256k1_modinv32_signed30 sStack_90;
  int iStack_64;
  secp256k1_modinv32_signed30 sStack_60;
  
  if ((x & 1) != 0) {
    uVar4 = 1;
    iVar6 = 6;
    do {
      uVar4 = (2 - uVar4 * x) * uVar4;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    return uVar4;
  }
  modinv2p64_cold_1();
  sStack_90.v[8] = in_RSI[8];
  sStack_90.v._0_8_ = *(undefined8 *)in_RSI;
  sStack_90.v._8_8_ = *(undefined8 *)(in_RSI + 2);
  sStack_90.v._16_8_ = *(undefined8 *)(in_RSI + 4);
  sStack_90.v._24_8_ = *(undefined8 *)(in_RSI + 6);
  sStack_60.v[8] = *(int32_t *)(x + 0x20);
  sStack_60.v._0_8_ = *(undefined8 *)x;
  sStack_60.v._8_8_ = *(undefined8 *)(x + 8);
  sStack_60.v._16_8_ = *(undefined8 *)(x + 0x10);
  sStack_60.v._24_8_ = *(undefined8 *)(x + 0x18);
  uVar9 = 9;
  iVar14 = -1;
  iVar6 = 0;
  uVar15 = 0;
  while( true ) {
    uVar12 = 0;
    if ((sStack_60.v[0] | 0xc0000000U) != 0) {
      for (; ((sStack_60.v[0] | 0xc0000000U) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
      }
    }
    iVar14 = iVar14 - uVar12;
    uVar15 = ((uint)sStack_90.v[0] >> 2 ^ (uint)sStack_90.v[0] >> 1) & uVar12 ^ uVar15;
    if (uVar12 == 0x1e) {
      sStack_a8.u = 0x40000000;
      iStack_ac = 1;
      sStack_a8.q = 0;
      sStack_a8.v = 0;
    }
    else {
      uVar8 = sStack_90.v[1] << 0x1e | sStack_90.v[0];
      iStack_ac = 1;
      sStack_a8.u = 1 << ((byte)uVar12 & 0x1f);
      uVar11 = (uint)(sStack_60.v[1] << 0x1e | sStack_60.v[0]) >> ((byte)uVar12 & 0x1f);
      iVar7 = 0x1e - uVar12;
      sStack_a8.v = 0;
      sStack_a8.q = 0;
      do {
        uVar12 = uVar11;
        iVar16 = sStack_a8.u;
        iVar13 = sStack_a8.v;
        if (iVar14 < 0) {
          iVar14 = -iVar14;
          uVar15 = uVar15 ^ (uVar8 & uVar11) >> 1;
          uVar12 = uVar8;
          iVar16 = sStack_a8.q;
          uVar8 = uVar11;
          sStack_a8.q = sStack_a8.u;
          iVar13 = iStack_ac;
          iStack_ac = sStack_a8.v;
        }
        iVar2 = iVar14 + 1;
        if (iVar7 <= iVar14 + 1) {
          iVar2 = iVar7;
        }
        uVar3 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar8 >> 1 & 0x7f] * (char)uVar12) <<
                (-(char)iVar2 & 0x1fU)) >> (-(char)iVar2 & 0x1fU);
        uVar12 = uVar3 * uVar8 + uVar12;
        sStack_a8.q = uVar3 * iVar16 + sStack_a8.q;
        uVar11 = -1 << ((byte)iVar7 & 0x1f) | uVar12;
        uVar1 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        bVar5 = (byte)uVar1;
        uVar11 = uVar12 >> (bVar5 & 0x1f);
        sStack_a8.u = iVar16 << (bVar5 & 0x1f);
        sStack_a8.v = iVar13 << (bVar5 & 0x1f);
        iStack_ac = uVar3 * iVar13 + iStack_ac;
        iVar14 = iVar14 - uVar1;
        uVar15 = uVar15 ^ (uVar8 >> 2 ^ uVar8 >> 1) & uVar1;
        iVar7 = iVar7 - uVar1;
      } while (iVar7 != 0);
    }
    uVar12 = (uint)uVar9;
    sStack_a8.r = iStack_ac;
    uStack_98 = uVar9;
    secp256k1_modinv32_update_fg_30_var(uVar12,&sStack_90,&sStack_60,&sStack_a8);
    if (sStack_90.v[0] == 1) break;
LAB_0015e424:
    uVar8 = uVar12 - 1;
    if (((int)(uVar12 - 2) < 0 || *(int *)((long)&uStack_98 + (long)(int)uVar12 * 4 + 4) != 0) ||
        (&iStack_64)[(int)uVar12] != 0) {
      uVar8 = uVar12;
    }
    iVar6 = iVar6 + 1;
    uVar9 = (ulong)uVar8;
    if (iVar6 == 0x32) {
      uVar15 = 0;
LAB_0015e45b:
      return (ulong)uVar15;
    }
  }
  if (1 < (int)uVar12) {
    uVar8 = 0;
    uVar10 = 1;
    do {
      uVar8 = uVar8 | sStack_90.v[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
    if (uVar8 != 0) goto LAB_0015e424;
  }
  uVar15 = 1 - (uVar15 * 2 & 2);
  goto LAB_0015e45b;
}

Assistant:

static uint64_t modinv2p64(uint64_t x) {
    /* If w = 1/x mod 2^(2^L), then w*(2 - w*x) = 1/x mod 2^(2^(L+1)). See
     * Hacker's Delight second edition, Henry S. Warren, Jr., pages 245-247 for
     * why. Start with L=0, for which it is true for every odd x that
     * 1/x=1 mod 2. Iterating 6 times gives us 1/x mod 2^64. */
    int l;
    uint64_t w = 1;
    CHECK(x & 1);
    for (l = 0; l < 6; ++l) w *= (2 - w*x);
    return w;
}